

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

void cleanup_world(void)

{
  level *plVar1;
  level_conflict *old;
  level *p;
  
  p = world;
  while (p != (level *)0x0) {
    string_free(p->name);
    string_free(p->up);
    string_free(p->down);
    plVar1 = p->next;
    mem_free(p);
    p = plVar1;
  }
  return;
}

Assistant:

static void cleanup_world(void)
{
	struct level *level = world;
	while (level) {
		struct level *old = level;
		string_free(level->name);
		string_free(level->up);
		string_free(level->down);
		level = level->next;
		mem_free(old);
	}
}